

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOSystem.cpp
# Opt level: O3

void __thiscall
IOSystemTest_accessDirectoryStackTest_Test::TestBody
          (IOSystemTest_accessDirectoryStackTest_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestIOSystem *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *in_R9;
  char *pcVar5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  string path;
  AssertHelper local_80;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_68 [32];
  AssertHelper local_48;
  string local_40;
  
  iVar4 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[10])();
  local_68._0_8_ = CONCAT71(local_68._1_7_,(char)iVar4) ^ 1;
  local_68._8_8_ = 0;
  if ((char)iVar4 == '\x01') {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_68,(AssertionResult *)"pImp->PopDirectory()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x42,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (((local_78.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_78.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_78.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)((ulong)local_78.data_._4_4_ << 0x20);
  local_68._0_4_ = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  local_68._4_4_ = extraout_var;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_40,"0U","pImp->StackSize()",(uint *)&local_78,
             (unsigned_long *)local_68);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_68);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pTVar2 = (this->super_IOSystemTest).pImp;
  paVar1 = &local_40.field_2;
  pcVar5 = "";
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"","");
  iVar4 = (*(pTVar2->super_IOSystem)._vptr_IOSystem[7])(pTVar2);
  local_68._0_8_ = CONCAT71(local_68._1_7_,(char)iVar4) ^ 1;
  local_68._8_8_ = (undefined8 *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    if ((char)iVar4 == '\0') goto LAB_00331405;
  }
  else {
    operator_delete(local_40._M_dataplus._M_p);
    if ((local_68._0_8_ & 1) != 0) goto LAB_00331405;
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_40,(internal *)local_68,(AssertionResult *)"pImp->PushDirectory( \"\" )","true",
             "false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
             ,0x44,local_40._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (((local_78.data_ != (AssertHelperData *)0x0) &&
      (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     (local_78.data_ != (AssertHelperData *)0x0)) {
    (**(code **)(*(long *)local_78.data_ + 8))();
  }
LAB_00331405:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"test/","");
  iVar4 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[7])();
  local_78.data_._0_1_ = (char)iVar4;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar4 == '\0') {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_78,
               (AssertionResult *)"pImp->PushDirectory( path )","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x46,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_68 + 0x10)
       ) {
      operator_delete((void *)local_68._0_8_);
    }
    if (((CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != 0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 1;
  iVar4 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  local_78.data_ = (AssertHelperData *)CONCAT44(extraout_var_00,iVar4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_68,"1U","pImp->StackSize()",(uint *)&local_80,
             (unsigned_long *)&local_78);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._8_8_ != (undefined8 *)0x0) {
      pcVar5 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x47,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (((local_78.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_78.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_78.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[8])();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_68,"path","pImp->CurrentDirectory()",&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_01,iVar4));
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (((local_78.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_78.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_78.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[10])();
  local_78.data_._0_1_ = (char)iVar4;
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar4 == '\0') {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)&local_78,(AssertionResult *)"pImp->PopDirectory()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x49,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_68 + 0x10)
       ) {
      operator_delete((void *)local_68._0_8_);
    }
    if (((CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != 0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,local_80.data_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 0;
  iVar4 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  local_78.data_ = (AssertHelperData *)CONCAT44(extraout_var_02,iVar4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_68,"0U","pImp->StackSize()",(uint *)&local_80,
             (unsigned_long *)&local_78);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x4a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (((local_78.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_78.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_78.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F( IOSystemTest, accessDirectoryStackTest ) {
    EXPECT_FALSE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
    EXPECT_FALSE( pImp->PushDirectory( "" ) );
    std::string path = "test/";
    EXPECT_TRUE( pImp->PushDirectory( path ) );
    EXPECT_EQ( 1U, pImp->StackSize() );
    EXPECT_EQ( path, pImp->CurrentDirectory() );
    EXPECT_TRUE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
}